

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O3

pair<std::reference_wrapper<const_dg::vr::Bucket>,_bool> __thiscall
dg::vr::ValueRelations::get(ValueRelations *this,size_t id)

{
  pointer ppVar1;
  Bucket *pBVar2;
  pair<std::reference_wrapper<const_dg::vr::Bucket>,_bool> pVar3;
  key_type local_18;
  
  ppVar1 = (this->graph).borderBuckets.
           super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppVar1 == (this->graph).borderBuckets.
                  super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0012bc1a:
      pBVar2 = RelationsGraph<dg::vr::ValueRelations>::getBorderBucket(&this->graph,id);
      local_18._M_data = pBVar2;
      std::
      map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
      ::operator[](&this->bucketToVals,&local_18);
LAB_0012bc3a:
      pVar3._8_8_ = 0;
      pVar3.first._M_data = pBVar2;
      return pVar3;
    }
    if (ppVar1->first == id) {
      pBVar2 = (ppVar1->second)._M_data;
      if (pBVar2 != (Bucket *)0x0) goto LAB_0012bc3a;
      goto LAB_0012bc1a;
    }
    ppVar1 = ppVar1 + 1;
  } while( true );
}

Assistant:

std::pair<ValueRelations::BRef, bool> ValueRelations::get(size_t id) {
    HandlePtr mH = getBorderH(id);
    return {mH ? *mH : newBorderBucket(id), false};
}